

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::formatValue<double>
               (ostream *out,char *param_2,char *fmtEnd,int ntrunc,double *value)

{
  int in_ECX;
  long in_RDX;
  void *in_RDI;
  double *in_R8;
  bool canConvertToVoidPtr;
  bool canConvertToChar;
  int in_stack_00000194;
  double *in_stack_00000198;
  ostream *in_stack_000001a0;
  double *in_stack_ffffffffffffffc8;
  uint6 in_stack_ffffffffffffffd0;
  undefined1 uVar1;
  undefined1 uVar2;
  
  uVar2 = 1;
  uVar1 = 0;
  detail::spaceFillIfNotFinite
            ((ostream *)CONCAT17(1,(uint7)in_stack_ffffffffffffffd0),
             (double)in_stack_ffffffffffffffc8);
  if (*(char *)(in_RDX + -1) == 'c') {
    detail::formatValueAsType<double,_char,_true>::invoke
              ((ostream *)CONCAT17(uVar2,CONCAT16(uVar1,in_stack_ffffffffffffffd0)),
               in_stack_ffffffffffffffc8);
  }
  else if (in_ECX < 0) {
    std::ostream::operator<<(in_RDI,*in_R8);
  }
  else {
    detail::formatTruncated<double>(in_stack_000001a0,in_stack_00000198,in_stack_00000194);
  }
  return;
}

Assistant:

inline void formatValue(std::ostream& out, const char* /*fmtBegin*/,
                        const char* fmtEnd, int ntrunc, const T& value)
{
#ifndef TINYFORMAT_ALLOW_WCHAR_STRINGS
    // Since we don't support printing of wchar_t using "%ls", make it fail at
    // compile time in preference to printing as a void* at runtime.
    typedef typename detail::is_wchar<T>::tinyformat_wchar_is_not_supported DummyType;
    (void) DummyType(); // avoid unused type warning with gcc-4.8
#endif
    // The mess here is to support the %c and %p conversions: if these
    // conversions are active we try to convert the type to a char or const
    // void* respectively and format that instead of the value itself.  For the
    // %p conversion it's important to avoid dereferencing the pointer, which
    // could otherwise lead to a crash when printing a dangling (const char*).
    const bool canConvertToChar = detail::is_convertible<T,char>::value;
    const bool canConvertToVoidPtr = detail::is_convertible<T, const void*>::value;
    detail::spaceFillIfNotFinite(out, value);
    if (canConvertToChar && *(fmtEnd-1) == 'c')
        detail::formatValueAsType<T, char>::invoke(out, value);
    else if (canConvertToVoidPtr && *(fmtEnd-1) == 'p')
        detail::formatValueAsType<T, const void*>::invoke(out, value);
#ifdef TINYFORMAT_OLD_LIBSTDCPLUSPLUS_WORKAROUND
    else if (detail::formatZeroIntegerWorkaround<T>::invoke(out, value)) /**/;
#endif
    else if (ntrunc >= 0) {
        // Take care not to overread C strings in truncating conversions like
        // "%.4s" where at most 4 characters may be read.
        detail::formatTruncated(out, value, ntrunc);
    }
    else
        out << value;
}